

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::
     LPFwriteSVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *p_svec,bool writeZeroCoefficients)

{
  type_conflict5 tVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *in_RSI;
  byte in_R8B;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  coeff;
  int j;
  int num_coeffs;
  char name [16];
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffec8;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffed0;
  NameSet *in_stack_fffffffffffffed8;
  byte local_11d;
  int i;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffee8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff60;
  int local_70;
  int local_6c;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_6c = 0;
  local_70 = 0;
  while (i = local_70,
        iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x15f521), i < iVar2) {
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffffee8,i);
    tVar1 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffed0);
    local_11d = 0;
    if (tVar1) {
      local_11d = in_R8B & 1 ^ 0xff;
    }
    if ((local_11d & 1) == 0) {
      if (local_6c == 0) {
        poVar3 = boost::multiprecision::operator<<
                           (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        in_stack_fffffffffffffed8 = (NameSet *)std::operator<<(poVar3," ");
        pcVar4 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (in_stack_fffffffffffffee8,i,in_stack_fffffffffffffed8,
                            (char *)in_stack_fffffffffffffed0);
        std::operator<<((ostream *)in_stack_fffffffffffffed8,pcVar4);
      }
      else {
        if (local_6c % 5 == 0) {
          std::operator<<(in_RSI,"\n\t");
        }
        tVar1 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffed0);
        if (tVar1) {
          in_stack_fffffffffffffed0 =
               (cpp_dec_float<100U,_int,_void> *)std::operator<<(in_RSI," - ");
          local_20 = &stack0xfffffffffffffee8;
          local_28 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&stack0xffffffffffffff40;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_29,local_28);
          local_10 = &stack0xfffffffffffffee8;
          local_18 = local_28;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          local_8 = &stack0xfffffffffffffee8;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::negate
                    (in_stack_fffffffffffffed0);
          boost::multiprecision::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
        else {
          std::operator<<(in_RSI," + ");
          boost::multiprecision::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
        in_stack_fffffffffffffec8 = (cpp_dec_float<100U,_int,_void> *)std::operator<<(in_RSI," ");
        pcVar4 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (in_stack_fffffffffffffee8,i,in_stack_fffffffffffffed8,
                            (char *)in_stack_fffffffffffffed0);
        std::operator<<((ostream *)in_stack_fffffffffffffec8,pcVar4);
      }
      local_6c = local_6c + 1;
    }
    local_70 = local_70 + 1;
  }
  return;
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<R>&   p_lp,                         ///< the LP
   std::ostream&         p_output,                     ///< output stream
   const NameSet*        p_cnames,                     ///< column names
   const SVectorBase<R>& p_svec,                       ///< vector to write
   const bool            writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const R coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns
         if(num_coeffs % SOPLEX_NUM_ENTRIES_PER_LINE == 0)
            p_output << "\n\t";

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}